

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O1

SysCallInt64Result cppnet::OsHandle::Accept(int64_t sockfd,Address *address)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  SysCallInt64Result SVar8;
  socklen_t addr_size;
  char str_addr [16];
  char str_addr_1 [46];
  sockaddr_storage client_addr;
  socklen_t local_fc;
  string local_f8;
  string local_d8;
  undefined6 uStack_b8;
  undefined8 uStack_b2;
  sockaddr local_a0 [8];
  
  local_fc = 0x80;
  iVar1 = accept((int)sockfd,local_a0,&local_fc);
  lVar5 = (long)iVar1;
  if (iVar1 < 0) {
    puVar3 = (uint *)__errno_location();
    uVar4 = (ulong)*puVar3;
  }
  else {
    if (local_a0[0].sa_family == 10) {
      address->_port = local_a0[0].sa_data._0_2_;
      address->_address_type = AT_IPV6;
      uStack_b8 = 0;
      uStack_b2 = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_6_ = 0;
      local_d8.field_2._14_2_ = 0;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      inet_ntop(10,local_a0[0].sa_data + 6,(char *)&local_d8,0x2e);
      paVar7 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)paVar7;
      sVar2 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar2);
      Address::SetIp(address,&local_f8);
      _Var6._M_p = local_f8._M_dataplus._M_p;
    }
    else {
      if (local_a0[0].sa_family != 2) {
        puVar3 = (uint *)__errno_location();
        uVar4 = (ulong)*puVar3;
        lVar5 = -1;
        goto LAB_00118113;
      }
      address->_port = local_a0[0].sa_data._0_2_ << 8 | (ushort)local_a0[0].sa_data._0_2_ >> 8;
      address->_address_type = AT_IPV4;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      inet_ntop(2,local_a0[0].sa_data + 2,(char *)&local_f8,0x10);
      paVar7 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar7;
      sVar2 = strlen((char *)&local_f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,&local_f8,(long)&local_f8._M_dataplus._M_p + sVar2);
      Address::SetIp(address,&local_d8);
      _Var6._M_p = local_d8._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p);
    }
    uVar4 = 0;
  }
LAB_00118113:
  SVar8._8_8_ = uVar4;
  SVar8._return_value = lVar5;
  return SVar8;
}

Assistant:

SysCallInt64Result OsHandle::Accept(int64_t sockfd, Address& address) {
    struct sockaddr_storage client_addr;
    socklen_t addr_size = sizeof(client_addr);
    int64_t ret = accept(sockfd, (sockaddr*)&client_addr, &addr_size);
    if (ret < 0) {
        return {ret, errno};
    }

    struct sockaddr* addr_pt = (struct sockaddr*)&client_addr;

    void *addr = nullptr;
    switch (addr_pt->sa_family) {
        case AF_INET:
		{
            addr = &((struct sockaddr_in *)addr_pt)->sin_addr;
            address.SetAddrPort(ntohs(((struct sockaddr_in *)addr_pt)->sin_port));
            address.SetType(AT_IPV4);
            // get IP
            char str_addr[INET_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        case AF_INET6:
		{
            addr = &((struct sockaddr_in6 *)addr_pt)->sin6_addr;
            address.SetAddrPort((((struct sockaddr_in6 *)addr_pt)->sin6_port));
            address.SetType(AT_IPV6);
            // get IP
            char str_addr[INET6_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET6, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        default:
            return {-1, errno};
    }
    
    return {ret, 0};
}